

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

_Bool square_remove_all_traps_of_type(chunk *c,loc grid,wchar_t t_idx_remove)

{
  trap *trap;
  _Bool _Var1;
  square *psVar2;
  trap *p;
  trap *ptVar3;
  bool bVar4;
  
  psVar2 = square((chunk_conflict *)c,grid);
  bVar4 = false;
  trap = psVar2->trap;
  p = (trap *)0x0;
  while (ptVar3 = p, p = trap, p != (trap *)0x0) {
    trap = p->next;
    if ((uint)p->t_idx == t_idx_remove) {
      mem_free(p);
      if (ptVar3 == (trap *)0x0) {
        square_set_trap((chunk_conflict *)c,grid,trap);
        bVar4 = true;
        p = (trap *)0x0;
        if (trap == (trap *)0x0) {
          psVar2 = square((chunk_conflict *)c,grid);
          flag_off(psVar2->info,3,9);
          p = (trap *)0x0;
        }
      }
      else {
        ptVar3->next = trap;
        bVar4 = true;
        p = ptVar3;
      }
    }
  }
  if ((bVar4) && (_Var1 = square_isseen((chunk_conflict *)c,grid), _Var1)) {
    square_memorize_traps(c,grid);
    square_light_spot(c,grid);
  }
  return bVar4;
}

Assistant:

bool square_remove_all_traps_of_type(struct chunk *c, struct loc grid,
		int t_idx_remove)
{
	bool removed = false;

	/* Look at the traps in this grid */
	struct trap *prev_trap = NULL;
	struct trap *trap = square(c, grid)->trap;

	while (trap) {
		struct trap *next_trap = trap->next;

		if (t_idx_remove == trap->t_idx) {
			mem_free(trap);
			removed = true;

			if (prev_trap) {
				prev_trap->next = next_trap;
			} else {
				square_set_trap(c, grid, next_trap);
				if (!next_trap) {
					sqinfo_off(square(c, grid)->info,
						SQUARE_TRAP);
				}
			}
		} else {
			prev_trap = trap;
		}

		trap = next_trap;
	}

	/* Refresh grids that the character can see */
	if (removed && square_isseen(c, grid)) {
		square_memorize_traps(c, grid);
		square_light_spot(c, grid);
	}

	return removed;
}